

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetModuleOrDeviceList
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,size_t numberOfDevices
          ,SINGLYLINKEDLIST_HANDLE deviceOrModuleList,IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type,
          int struct_version)

{
  LOGGER_LOG p_Var1;
  BUFFER_HANDLE responseBuffer_00;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  BUFFER_HANDLE responseBuffer;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  int struct_version_local;
  IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type_local;
  SINGLYLINKEDLIST_HANDLE deviceOrModuleList_local;
  size_t numberOfDevices_local;
  char *deviceId_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
     (deviceOrModuleList == (SINGLYLINKEDLIST_HANDLE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x718,1,
                "Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((numberOfDevices == 0) || (IOTHUB_DEVICES_MAX_REQUEST < numberOfDevices)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x71d,1,
                "numberOfDevices has to be between 1 and 1000");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) &&
          ((struct_version < 1 || (1 < struct_version)))) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x722,1,"Invalid module version");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
  }
  else {
    responseBuffer_00 = BUFFER_new();
    if (responseBuffer_00 == (BUFFER_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x72b,1,
                  "BUFFER_new failed for responseBuffer");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else {
      l._4_4_ = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_GET_DEVICE_LIST,deviceId,
                                    (char *)0x0,(BUFFER_HANDLE)0x0,numberOfDevices,responseBuffer_00
                                   );
      if (l._4_4_ == IOTHUB_REGISTRYMANAGER_ERROR) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"IoTHubRegistryManager_GetModuleOrDeviceList",0x730,1,
                    "Failure sending HTTP request for get device list");
        }
      }
      else if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
        l._4_4_ = parseDeviceOrModuleListJson
                            (responseBuffer_00,deviceOrModuleList,struct_type,struct_version);
      }
    }
    if (responseBuffer_00 != (BUFFER_HANDLE)0x0) {
      BUFFER_delete(responseBuffer_00);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetModuleOrDeviceList(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, size_t numberOfDevices, SINGLYLINKEDLIST_HANDLE deviceOrModuleList, IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type, int struct_version)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleList == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((numberOfDevices == 0) || (numberOfDevices > IOTHUB_DEVICES_MAX_REQUEST))
    {
        LogError("numberOfDevices has to be between 1 and 1000");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) && ((struct_version < IOTHUB_MODULE_VERSION_1) || (struct_version > IOTHUB_MODULE_VERSION_LATEST)))
    {
        LogError("Invalid module version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        BUFFER_HANDLE responseBuffer = NULL;

        if ((responseBuffer = BUFFER_new()) == NULL)
        {
            LogError("BUFFER_new failed for responseBuffer");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_GET_DEVICE_LIST, deviceId, NULL, NULL, numberOfDevices, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
        {
            LogError("Failure sending HTTP request for get device list");
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            result = parseDeviceOrModuleListJson(responseBuffer, deviceOrModuleList, struct_type, struct_version);
        }

        if (responseBuffer != NULL)
        {
            BUFFER_delete(responseBuffer);
        }
    }
    return result;
}